

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  size_t length,semantic_tag param_3,ser_context *param_4,error_code *ec)

{
  int iVar1;
  back_insert_iterator<jsoncons::binary_stream_sink> bVar2;
  binary_stream_sink *pbVar3;
  int iVar4;
  binary_stream_sink *in_RSI;
  error_code *in_RDI;
  binary_stream_sink *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  binary_stream_sink *pbVar5;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  uchar uVar6;
  unsigned_short val;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  uint val_00;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffff90;
  
  val_00 = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar4 = *(int *)&in_RDI[0xe]._M_cat + 1;
  *(int *)&in_RDI[0xe]._M_cat = iVar4;
  iVar1 = cbor_options_common::max_nesting_depth
                    ((cbor_options_common *)
                     ((long)&in_RDI[4]._M_value + *(long *)(*(long *)(in_RDI + 4) + -0x18)));
  if (iVar1 < iVar4) {
    std::error_code::operator=
              (in_RDI,CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  }
  else {
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::cbor::cbor_container_type,unsigned_long&>
              ((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                *)in_RDI,
               (cbor_container_type *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))),
               in_stack_ffffffffffffff60);
    val = (unsigned_short)((uint)iVar4 >> 0x10);
    if (in_RSI < (binary_stream_sink *)0x18) {
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                ((uchar)((uint)iVar4 >> 0x18),in_stack_ffffffffffffff80);
    }
    else if (in_RSI < (binary_stream_sink *)0x100) {
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      uVar6 = (uchar)((uint)iVar4 >> 0x18);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (uVar6,in_stack_ffffffffffffff80);
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (uVar6,in_stack_ffffffffffffff80);
    }
    else if (in_RSI < (binary_stream_sink *)0x10000) {
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                ((uchar)(val >> 8),in_stack_ffffffffffffff80);
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (val,in_stack_ffffffffffffff80);
    }
    else if (in_RSI < (binary_stream_sink *)0x100000000) {
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                ((uchar)((uint)iVar4 >> 0x18),in_stack_ffffffffffffff80);
      bVar2 = std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (val_00,bVar2);
    }
    else {
      pbVar5 = in_RSI;
      pbVar3 = (binary_stream_sink *)std::numeric_limits<unsigned_long>::max();
      uVar6 = (uchar)((uint)iVar4 >> 0x18);
      if (pbVar5 <= pbVar3) {
        bVar2 = std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (uVar6,in_stack_ffffffffffffff80);
        std::back_inserter<jsoncons::binary_stream_sink>(in_RSI);
        binary::
        native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ((unsigned_long)bVar2.container,in_stack_ffffffffffffff90);
      }
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(cbor_container_type::object, length);

        if (length <= 0x17)
        {
            binary::native_to_big(static_cast<uint8_t>(0xa0 + length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb8), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb9), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xba), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0xbb), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        JSONCONS_VISITOR_RETURN;
    }